

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O2

void __thiscall
cmExtraEclipseCDT4Generator::CreateSourceProjectFile(cmExtraEclipseCDT4Generator *this)

{
  string *__lhs;
  bool bVar1;
  string filename;
  cmXMLWriter xml;
  string name;
  cmGeneratedFileStream fout;
  allocator<char> local_331;
  string local_330;
  string local_310;
  cmXMLWriter local_2f0;
  string local_298;
  cmGeneratedFileStream local_278;
  
  __lhs = &this->HomeDirectory;
  bVar1 = std::operator!=(__lhs,&this->HomeOutputDirectory);
  if (bVar1) {
    cmLocalGenerator::GetProjectName_abi_cxx11_
              ((string *)&local_278,
               (cmLocalGenerator *)
               (((((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->
                 LocalGenerators).
                 super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_t).
               super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t)
    ;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f0,"Source",(allocator<char> *)&local_330);
    GetPathBasename(&local_310,__lhs);
    GenerateProjectName(&local_298,(string *)&local_278,(string *)&local_2f0,&local_310);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_278);
    std::operator+(&local_310,__lhs,"/.project");
    cmGeneratedFileStream::cmGeneratedFileStream(&local_278,&local_310,false,None);
    if (((&local_278.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
         [*(long *)((long)local_278.super_ofstream.
                          super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream +
                   -0x18)] & 5) == 0) {
      cmXMLWriter::cmXMLWriter(&local_2f0,(ostream *)&local_278,0);
      cmXMLWriter::StartDocument(&local_2f0,"UTF-8");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_330,"projectDescription",&local_331);
      cmXMLWriter::StartElement(&local_2f0,&local_330);
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_330,"name",&local_331);
      cmXMLWriter::Element<std::__cxx11::string>(&local_2f0,&local_330,&local_298);
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_330,"comment",&local_331);
      cmXMLWriter::Element<char[1]>(&local_2f0,&local_330,(char (*) [1])0x70a819);
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_330,"projects",&local_331)
      ;
      cmXMLWriter::Element<char[1]>(&local_2f0,&local_330,(char (*) [1])0x70a819);
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_330,"buildSpec",&local_331);
      cmXMLWriter::Element<char[1]>(&local_2f0,&local_330,(char (*) [1])0x70a819);
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_330,"natures",&local_331);
      cmXMLWriter::Element<char[1]>(&local_2f0,&local_330,(char (*) [1])0x70a819);
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_330,"linkedResources",&local_331);
      cmXMLWriter::StartElement(&local_2f0,&local_330);
      std::__cxx11::string::~string((string *)&local_330);
      if (this->SupportsVirtualFolders == true) {
        CreateLinksToSubprojects(this,&local_2f0,__lhs);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&this->SrcLinkedResources);
      }
      cmXMLWriter::EndElement(&local_2f0);
      cmXMLWriter::EndElement(&local_2f0);
      cmXMLWriter::EndDocument(&local_2f0);
      cmXMLWriter::~cmXMLWriter(&local_2f0);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream(&local_278);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string((string *)&local_298);
    return;
  }
  __assert_fail("this->HomeDirectory != this->HomeOutputDirectory",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmExtraEclipseCDT4Generator.cxx"
                ,0xca,"void cmExtraEclipseCDT4Generator::CreateSourceProjectFile()");
}

Assistant:

void cmExtraEclipseCDT4Generator::CreateSourceProjectFile()
{
  assert(this->HomeDirectory != this->HomeOutputDirectory);

  // set up the project name: <project>-Source@<baseSourcePathName>
  const auto& lg = this->GlobalGenerator->GetLocalGenerators()[0];
  std::string name = cmExtraEclipseCDT4Generator::GenerateProjectName(
    lg->GetProjectName(), "Source",
    cmExtraEclipseCDT4Generator::GetPathBasename(this->HomeDirectory));

  const std::string filename = this->HomeDirectory + "/.project";
  cmGeneratedFileStream fout(filename);
  if (!fout) {
    return;
  }

  cmXMLWriter xml(fout);
  xml.StartDocument("UTF-8");
  xml.StartElement("projectDescription");
  xml.Element("name", name);
  xml.Element("comment", "");
  xml.Element("projects", "");
  xml.Element("buildSpec", "");
  xml.Element("natures", "");
  xml.StartElement("linkedResources");

  if (this->SupportsVirtualFolders) {
    this->CreateLinksToSubprojects(xml, this->HomeDirectory);
    this->SrcLinkedResources.clear();
  }

  xml.EndElement(); // linkedResources
  xml.EndElement(); // projectDescription
  xml.EndDocument();
}